

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

string * getNextIp(string *__return_storage_ptr__,string *baseIp,int iter)

{
  uint uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  in_addr_t iVar5;
  char *__s;
  long *local_60 [2];
  long local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  allocator<char> local_31;
  
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  pcVar3 = (baseIp->_M_dataplus)._M_p;
  paVar2 = &baseIp->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&baseIp->field_2 + 8);
    local_40->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = baseIp->_M_string_length;
  (baseIp->_M_dataplus)._M_p = (pointer)paVar2;
  baseIp->_M_string_length = 0;
  (baseIp->field_2)._M_local_buf[0] = '\0';
  if (0 < iter) {
    do {
      iVar5 = inet_addr((__return_storage_ptr__->_M_dataplus)._M_p);
      uVar1 = (iVar5 >> 0x18 | (iVar5 & 0xff0000) >> 8 | (iVar5 & 0xff00) << 8 | iVar5 << 0x18) + 1;
      __s = inet_ntoa((in_addr)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                               uVar1 * 0x1000000));
      std::__cxx11::string::string<std::allocator<char>>((string *)local_60,__s,&local_31);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_60);
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      iter = iter + -1;
    } while (iter != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getNextIp(std::string baseIp, const int iter = 1)
{
    std::string nextIp = std::move(baseIp);
    for (int i = 0; i < iter; i++)
    {
        // convert the input IP address to an integer
        in_addr_t address = inet_addr(nextIp.c_str());

        // add one to the value (making sure to get the correct byte orders)
        address = ntohl(address);
        address += 1;
        address = htonl(address);

        // pack the address into the struct inet_ntoa expects
        struct in_addr address_struct;
        address_struct.s_addr = address;

        // convert back to a string
        nextIp = std::string(inet_ntoa(address_struct));
    }
    return nextIp;
}